

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastSqrt(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vTmp,Vec_Int_t *vRes)

{
  int *pNew_00;
  int iVar1;
  int iVar2;
  int local_7c;
  int local_54;
  int local_50;
  int Carry;
  int k;
  int i;
  int *pSumP;
  int *pSum;
  int *pRes;
  Vec_Int_t *vRes_local;
  Vec_Int_t *vTmp_local;
  int *piStack_18;
  int nNum_local;
  int *pNum_local;
  Gia_Man_t *pNew_local;
  
  local_54 = -1;
  pRes = &vRes->nCap;
  vRes_local = vTmp;
  vTmp_local._4_4_ = nNum;
  piStack_18 = pNum;
  pNum_local = (int *)pNew;
  if (nNum % 2 == 0) {
    Vec_IntFill(vRes,nNum / 2,0);
    Vec_IntFill(vRes_local,vTmp_local._4_4_ << 1,0);
    pSum = Vec_IntArray((Vec_Int_t *)pRes);
    pSumP = Vec_IntArray(vRes_local);
    _k = pSumP + vTmp_local._4_4_;
    for (Carry = 0; Carry < vTmp_local._4_4_ / 2; Carry = Carry + 1) {
      *_k = piStack_18[vTmp_local._4_4_ + Carry * -2 + -2];
      _k[1] = piStack_18[vTmp_local._4_4_ + Carry * -2 + -1];
      for (local_50 = 0; local_50 < Carry + 1; local_50 = local_50 + 1) {
        _k[local_50 + 2] = pSumP[local_50];
      }
      for (local_50 = 0; pNew_00 = pNum_local, local_50 < Carry + 3; local_50 = local_50 + 1) {
        if ((local_50 < 2) || (Carry + 2 <= local_50)) {
          iVar2 = _k[local_50];
          if (local_50 == 0) {
            local_7c = 1;
          }
          else {
            local_7c = local_54;
          }
          iVar1 = Abc_LitNot(local_7c);
          Wlc_BlastFullAdder((Gia_Man_t *)pNew_00,iVar2,iVar1,1,&local_54,pSumP + local_50);
        }
        else {
          iVar2 = _k[local_50];
          iVar1 = Abc_LitNot(pSum[(Carry - local_50) + 1]);
          Wlc_BlastFullAdder((Gia_Man_t *)pNew_00,iVar2,iVar1,local_54,&local_54,pSumP + local_50);
        }
        if ((local_50 == 0) || (Carry < local_50)) {
          local_54 = Abc_LitNot(local_54);
        }
      }
      iVar2 = Abc_LitNot(local_54);
      pSum[Carry] = iVar2;
      for (local_50 = 0; local_50 < Carry + 3; local_50 = local_50 + 1) {
        iVar2 = Gia_ManHashMux((Gia_Man_t *)pNum_local,pSum[Carry],pSumP[local_50],_k[local_50]);
        pSumP[local_50] = iVar2;
      }
    }
    Vec_IntReverseOrder((Vec_Int_t *)pRes);
    return;
  }
  __assert_fail("nNum % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                ,0x2fb,"void Wlc_BlastSqrt(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Wlc_BlastSqrt( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vTmp, Vec_Int_t * vRes )
{
    int * pRes, * pSum, * pSumP;
    int i, k, Carry = -1;
    assert( nNum % 2 == 0 );
    Vec_IntFill( vRes, nNum/2, 0 );
    Vec_IntFill( vTmp, 2*nNum, 0 );
    pRes = Vec_IntArray( vRes );
    pSum = Vec_IntArray( vTmp );
    pSumP = pSum + nNum;
    for ( i = 0; i < nNum/2; i++ )
    {
        pSumP[0] = pNum[nNum-2*i-2];
        pSumP[1] = pNum[nNum-2*i-1];
        for ( k = 0; k < i+1; k++ )
            pSumP[k+2] = pSum[k];
        for ( k = 0; k < i + 3; k++ )
        {
            if ( k >= 2 && k < i + 2 ) // middle ones
                Wlc_BlastFullAdder( pNew, pSumP[k], Abc_LitNot(pRes[i-k+1]), Carry, &Carry, &pSum[k] );
            else
                Wlc_BlastFullAdder( pNew, pSumP[k], Abc_LitNot(k ? Carry:1), 1,     &Carry, &pSum[k] );
            if ( k == 0 || k > i )
                Carry = Abc_LitNot(Carry);
        }
        pRes[i] = Abc_LitNot(Carry);
        for ( k = 0; k < i + 3; k++ )
            pSum[k] = Gia_ManHashMux( pNew, pRes[i], pSum[k], pSumP[k] );
    }
    Vec_IntReverseOrder( vRes );
}